

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementHexaANCF_3843 *this)

{
  double *pdVar1;
  double *pdVar2;
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *s;
  double *s_00;
  double *s_01;
  double *s_02;
  double *s_03;
  double *s_04;
  Matrix<double,__1,__1,_0,__1,__1> *this_01;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [8];
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar11;
  Scalar *scalar;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long startRow;
  long lVar20;
  uint t;
  long row;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  double GQWeight_det_J_0xi;
  ChMatrixNM<double,_3,_3> D33;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNx3c Sxi_D_0xi;
  MatrixNx3c Sxi_D;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  MatrixNxN scale;
  double local_4b00;
  double local_4af8;
  double local_4af0;
  double local_4ae8;
  double local_4ae0;
  double local_4ad8;
  double local_4ad0;
  double local_4ac8;
  double local_4ac0;
  double local_4ab8;
  Matrix<double,_3,_3,_1,_3,_3> local_4ab0;
  Matrix<double,__1,__1,_0,__1,__1> local_4a68;
  double local_4a50;
  double local_4a48;
  double local_4a40;
  double local_4a38;
  double local_4a30;
  double local_4a28;
  element_type *local_4a20;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_4a18;
  element_type *peStack_4a10;
  element_type *peStack_4a08;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_4a00;
  element_type *peStack_49f8;
  PointerType local_49f0;
  undefined8 uStack_49e8;
  XprTypeNested pMStack_49e0;
  long lStack_49d8;
  long lStack_49d0;
  Index IStack_49c8;
  undefined1 local_49b0 [16];
  scalar_constant_op<double> sStack_49a0;
  variable_if_dynamic<long,__1> vStack_4998;
  variable_if_dynamic<long,__1> vStack_4990;
  element_type *peStack_4988;
  Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false> local_4980;
  undefined1 local_4950 [72];
  Matrix<double,_9,_9,_1,_9,_9> local_4908;
  element_type local_4680 [2];
  element_type local_4380 [2];
  undefined1 local_4080 [24];
  variable_if_dynamic<long,__1> vStack_4068;
  variable_if_dynamic<long,__1> vStack_4060;
  variable_if_dynamic<long,__1> vStack_4058;
  element_type *peStack_4050;
  RhsNested local_4048;
  element_type *local_4040;
  double *local_4038;
  element_type *local_4030;
  undefined1 local_2080 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2078;
  scalar_constant_op<double> sStack_2070;
  variable_if_dynamic<long,__1> vStack_2068;
  variable_if_dynamic<long,__1> vStack_2060;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_2058;
  undefined1 extraout_var [56];
  
  this_00 = &this->m_O1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x400,0x400)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x400,
             0x400);
  this_01 = &this->m_K3Compact;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x20,0x20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             0x20,0x20);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K13Compact);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00);
  std::__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2> *)local_2080
             ,&(this->m_material).
               super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>);
  auVar10 = local_2080;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2078);
  local_4a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0];
  local_4a48 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [6];
  local_4a28 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [0xc];
  local_4a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)(((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
              [0x1e];
  local_4a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)(((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
              [0x18];
  local_4a40 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [0x12];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
       = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[1];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
       = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
       = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
       = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1f];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
       = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x19];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
       = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x13];
  local_4af8 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [2];
  local_4ad8 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [8];
  local_4ab8 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [0xe];
  local_4af0 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [0x20];
  local_4ae8 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [0x1a];
  local_4ad0 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
               [0x14];
  _Stack_2078._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)local_2080 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 5;
  sStack_2070.m_other = 4.94065645841247e-324;
  vStack_2068.m_value = 1;
  local_4ae0 = local_4af0;
  local_4ac8 = local_4ae8;
  local_4ac0 = local_4ad0;
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
       = local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
       = local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
  local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
       = local_4ab0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
  local_4a50 = (double)local_4a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
  local_4a38 = (double)local_4a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols;
  local_4a30 = local_4a40;
  local_4908.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[0]
       = (double)local_4a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
  local_2080 = (undefined1  [8])&local_4908;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_2080,pdVar1)
  ;
  pdVar2 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 4;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 1);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 3;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 2);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x1e;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pdVar2 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x23;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pdVar3 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x22;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pdVar4 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x1f;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar4);
  pdVar5 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x21;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pdVar6 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x20;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar6);
  s = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x18;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s);
  s_00 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x1d
  ;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_00);
  s_01 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x1c
  ;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_01);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_00);
  s_02 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x19
  ;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_02);
  s_03 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x1b
  ;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_03);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_01);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_03);
  s_04 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x1a
  ;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_04);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar4);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar6);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 6);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0xb;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pdVar2 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 10
  ;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 7);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 9;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 8);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x12;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pdVar2 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x17;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pdVar3 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x16;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pdVar4 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x13;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar4);
  pdVar5 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x15;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pdVar6 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x14;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar6);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_00);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_01);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_00);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_02);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_03);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_01);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_03);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar11,s_04);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar4);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar3);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar5);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar6);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 0xc);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x11;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pdVar2 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0x10;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                               m_storage.m_data.array + 0xd);
  pdVar1 = (((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
           0xf;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar2);
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar11,pdVar1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
            (pCVar11,(((ChMatrixNM<double,_6,_6> *)((long)auVar10 + 0x20))->
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                     array + 0xe);
  Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_2080);
  lVar12 = *(long *)(DAT_011df560 + 0x48);
  lVar20 = *(long *)(DAT_011df560 + 0x50);
  lVar13 = DAT_011df560;
  for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < (ulong)(lVar20 - lVar12 >> 3);
      uVar14 = uVar14 + 1) {
    for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < (ulong)(lVar20 - lVar12 >> 3);
        uVar16 = uVar16 + 1) {
      uVar18 = 0;
      while( true ) {
        lVar20 = *(long *)(lVar13 + 0x50);
        lVar12 = *(long *)(lVar13 + 0x48);
        uVar19 = (ulong)uVar18;
        if ((ulong)(lVar20 - lVar12 >> 3) <= uVar19) break;
        lVar20 = *(long *)(static_tables_3843 + 0x48);
        dVar7 = *(double *)(lVar20 + uVar15 * 8);
        dVar8 = *(double *)(lVar20 + uVar17 * 8);
        dVar9 = *(double *)(lVar20 + uVar19 * 8);
        Calc_Sxi_D(this,(MatrixNx3c *)local_4380,*(double *)(lVar12 + uVar15 * 8),
                   *(double *)(lVar12 + uVar17 * 8),*(double *)(lVar12 + uVar19 * 8));
        local_4080._0_8_ = (element_type *)local_4950;
        local_2080 = (undefined1  [8])&this->m_ebar0;
        _Stack_2078._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4380;
        Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_4080,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_3,_0,_32,_3>,_0>_>
                    *)local_2080);
        local_2080 = (undefined1  [8])local_4380;
        _Stack_2078._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4950;
        Eigen::PlainObjectBase<Eigen::Matrix<double,32,3,0,32,3>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,32,3,0,32,3>> *)local_4680,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                    *)local_2080);
        auVar22._0_8_ =
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                       ((Matrix<double,_3,_3,_1,_3,_3> *)local_4950);
        auVar22._8_56_ = extraout_var;
        auVar21._8_8_ = 0x8000000000000000;
        auVar21._0_8_ = 0x8000000000000000;
        auVar21 = vxorpd_avx512vl(auVar22._0_16_,auVar21);
        local_4080._16_8_ = &local_4a68;
        local_4b00 = auVar21._0_8_ * dVar7 * dVar8 * dVar9;
        vStack_4058.m_value = (long)&local_4ab0;
        local_4038 = &local_4af8;
        local_4a20 = (element_type *)(local_4b00 * 0.5);
        local_4080._8_8_ = local_4680;
        vStack_4068.m_value = (long)local_4680;
        vStack_4060.m_value = (long)local_4680;
        peStack_4050 = local_4680;
        local_4040 = local_4680;
        local_4030 = local_4680;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>_>
                          *)local_2080,(double *)&local_4a20,(StorageBaseType *)local_4080);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>_>_>
                    *)local_2080);
        for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>::Block
                      ((Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false> *)&local_4a20,
                       &local_4908,lVar20 * 3,lVar12 * 3);
            vStack_4058.m_value = (long)pMStack_4a00;
            peStack_4050 = peStack_49f8;
            local_4080._8_8_ = local_4a20;
            local_4080._16_8_ = pMStack_4a18;
            vStack_4068.m_value = (long)peStack_4a10;
            vStack_4060.m_value = (long)peStack_4a08;
            local_4080._0_8_ = local_4680;
            local_4048.m_matrix = (non_const_type)local_4680;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,32,32,1,32,32>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>>
                      ((Matrix<double,_32,_32,_1,_32,_32> *)local_2080,
                       (Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>
                        *)local_4080);
            Eigen::DenseBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>::operator*=
                      ((DenseBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_> *)local_2080,
                       &local_4b00);
            Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false> *)local_49b0,
                       (Matrix<double,_32,_3,_0,_32,_3> *)local_4680,0,lVar20);
            Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>::Block
                      (&local_4980,(Matrix<double,_32,_3,_0,_32,_3> *)local_4680,0,lVar12);
            lStack_49d0 = local_4980.
                          super_BlockImpl<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_true>
                          .m_startCol.m_value;
            IStack_49c8 = local_4980.
                          super_BlockImpl<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_true>
                          .m_outerStride;
            local_49f0 = local_4980.
                         super_BlockImpl<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>,_0>
                         .m_data;
            uStack_49e8 = local_4980.
                          super_BlockImpl<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>,_0>
                          ._8_8_;
            pMStack_49e0 = local_4980.
                           super_BlockImpl<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_true>
                           .m_xpr;
            lStack_49d8 = local_4980.
                          super_BlockImpl<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false,_true>
                          .m_startRow.m_value;
            local_4a20 = (element_type *)local_49b0._0_8_;
            pMStack_4a18 = (Matrix<double,__1,__1,_0,__1,__1> *)local_49b0._8_8_;
            peStack_4a10 = (element_type *)sStack_49a0.m_other;
            peStack_4a08 = (element_type *)vStack_4998.m_value;
            pMStack_4a00 = (Matrix<double,_3,_3,_1,_3,_3> *)vStack_4990.m_value;
            peStack_49f8 = peStack_4988;
            Eigen::PlainObjectBase<Eigen::Matrix<double,32,32,1,32,32>>::
            _set_noalias<Eigen::Product<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,false>>,0>>
                      ((PlainObjectBase<Eigen::Matrix<double,32,32,1,32,32>> *)local_4080,
                       (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_false>_>,_0>_>
                        *)&local_4a20);
            for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
              startRow = 0;
              for (row = 0; row != 0x20; row = row + 1) {
                scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>,_1>::
                         operator()((DenseCoeffsBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>,_1> *)
                                    local_2080,row,lVar13);
                Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>
                                  *)local_49b0,scalar,(StorageBaseType *)local_4080);
                Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>::Block
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false> *)
                           &local_4a20,this_00,startRow,lVar13 << 5);
                Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,32,32,false>>::
                operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,32,32,false>>
                            *)&local_4a20,
                           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>
                            *)local_49b0);
                startRow = startRow + 0x20;
              }
            }
          }
        }
        uVar18 = uVar18 + 1;
        lVar13 = DAT_011df560;
      }
    }
  }
  for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
    for (lVar12 = 0; lVar12 != 0x400; lVar12 = lVar12 + 0x20) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false> *)local_4080,
                 this_00,lVar12,lVar20 << 5);
      vStack_2060.m_value = vStack_4060.m_value;
      pMStack_2058 = (Matrix<double,_3,_3,_1,_3,_3> *)vStack_4058.m_value;
      local_2080 = (undefined1  [8])local_4080._0_8_;
      _Stack_2078._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4080._8_8_;
      sStack_2070.m_other = (double)local_4080._16_8_;
      vStack_2068.m_value = vStack_4068.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false> *)local_4380,
                 &this->m_O2,lVar12,lVar20 << 5);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,32,32,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,32,32,false>>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false> *)local_4380,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>
                  *)local_2080);
    }
  }
  return;
}

Assistant:

void ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = NP - 1;  // Gauss-Quadrature table index for xi, eta, and zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
    // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
    // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
    // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
    // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
    // =============================================================================
    ChMatrixNM<double, 3, 3> D11;
    ChMatrixNM<double, 3, 3> D22;
    ChMatrixNM<double, 3, 3> D33;
    D11(0, 0) = D(0, 0);
    D11(1, 1) = D(1, 0);
    D11(2, 2) = D(2, 0);
    D11(1, 0) = D(5, 0);
    D11(0, 1) = D(5, 0);
    D11(2, 0) = D(4, 0);
    D11(0, 2) = D(4, 0);
    D11(2, 1) = D(3, 0);
    D11(1, 2) = D(3, 0);

    D22(0, 0) = D(0, 1);
    D22(1, 1) = D(1, 1);
    D22(2, 2) = D(2, 1);
    D22(1, 0) = D(5, 1);
    D22(0, 1) = D(5, 1);
    D22(2, 0) = D(4, 1);
    D22(0, 2) = D(4, 1);
    D22(2, 1) = D(3, 1);
    D22(1, 2) = D(3, 1);

    D33(0, 0) = D(0, 2);
    D33(1, 1) = D(1, 2);
    D33(2, 2) = D(2, 2);
    D33(1, 0) = D(5, 2);
    D33(0, 1) = D(5, 2);
    D33(2, 0) = D(4, 2);
    D33(0, 2) = D(4, 2);
    D33(2, 1) = D(3, 2);
    D33(1, 2) = D(3, 2);

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    ChMatrixNM<double, 9, 9> D_block;
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
    // the internal force calculations
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];

                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                               (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                                Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

                MatrixNxN scale;
                for (unsigned int n = 0; n < 3; n++) {
                    for (unsigned int c = 0; c < 3; c++) {
                        scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                        scale *= GQWeight_det_J_0xi;

                        MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                            Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                        for (unsigned int f = 0; f < NSF; f++) {
                            for (unsigned int t = 0; t < NSF; t++) {
                                m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                    scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                            }
                        }
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}